

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O2

bool __thiscall tinygltf::Accessor::operator==(Accessor *this,Accessor *other)

{
  bool bVar1;
  __type _Var2;
  
  if (this->bufferView != other->bufferView) {
    return false;
  }
  if ((((((this->byteOffset == other->byteOffset) && (this->componentType == other->componentType))
        && (this->count == other->count)) &&
       ((bVar1 = std::operator==(&(this->extensions)._M_t,&(other->extensions)._M_t), bVar1 &&
        (bVar1 = Equals(&this->extras,&other->extras), bVar1)))) &&
      ((bVar1 = Equals(&this->maxValues,&other->maxValues), bVar1 &&
       ((bVar1 = Equals(&this->minValues,&other->minValues), bVar1 &&
        (_Var2 = std::operator==(&this->name,&other->name), _Var2)))))) &&
     (this->normalized == other->normalized)) {
    return this->type == other->type;
  }
  return false;
}

Assistant:

bool Accessor::operator==(const Accessor &other) const {
  return this->bufferView == other.bufferView &&
         this->byteOffset == other.byteOffset &&
         this->componentType == other.componentType &&
         this->count == other.count && this->extensions == other.extensions &&
         this->extras == other.extras &&
         Equals(this->maxValues, other.maxValues) &&
         Equals(this->minValues, other.minValues) && this->name == other.name &&
         this->normalized == other.normalized && this->type == other.type;
}